

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

void Abc_NtkDumpOneCex(FILE *pFile,Abc_Ntk_t *pNtk,Abc_Cex_t *pCex,int fPrintFull,int fNames,
                      int fUseFfNames,int fMinimize,int fUseOldMin,int fCheckCex,int fUseSatBased,
                      int fHighEffort,int fAiger,int fVerbose)

{
  long *plVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Aig_Man_t *pAVar7;
  Abc_Cex_t *pAVar8;
  char *pcVar9;
  Vec_Ptr_t *pVVar10;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong local_70;
  Abc_Cex_t *local_60;
  int local_54;
  void *local_50;
  ulong local_48;
  Vec_Ptr_t *local_40;
  long local_38;
  
  if (fPrintFull != 0) {
    pAVar7 = Abc_NtkToDar(pNtk,0,1);
    pAVar8 = Saig_ManExtendCex(pAVar7,pCex);
    local_60 = pAVar8;
    Aig_ManStop(pAVar7);
    pVVar10 = pNtk->vCis;
    iVar4 = pCex->iFrame;
    if (pAVar8->nBits != (iVar4 + 1) * pVVar10->nSize) {
      __assert_fail("pCexFull->nBits == Abc_NtkCiNum(pNtk) * (pCex->iFrame + 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/io.c"
                    ,0x999,
                    "void Abc_NtkDumpOneCex(FILE *, Abc_Ntk_t *, Abc_Cex_t *, int, int, int, int, int, int, int, int, int, int)"
                   );
    }
    if (-1 < iVar4) {
      uVar6 = 0;
      do {
        if (0 < pVVar10->nSize) {
          lVar13 = 0;
          do {
            pcVar9 = Abc_ObjName((Abc_Obj_t *)pVVar10->pArray[lVar13]);
            uVar12 = pNtk->vCis->nSize * uVar6 + (int)lVar13;
            fprintf((FILE *)pFile,"%s@%d=%c ",pcVar9,(ulong)uVar6,
                    (ulong)((((uint)(&pAVar8[1].iPo)[(int)uVar12 >> 5] >> (uVar12 & 0x1f) & 1) != 0)
                           + 0x30));
            lVar13 = lVar13 + 1;
            pVVar10 = pNtk->vCis;
          } while (lVar13 < pVVar10->nSize);
          iVar4 = pCex->iFrame;
        }
        bVar2 = (int)uVar6 < iVar4;
        uVar6 = uVar6 + 1;
      } while (bVar2);
    }
    goto LAB_0032bae0;
  }
  if (fNames == 0) {
    pVVar10 = pNtk->vBoxes;
    if (0 < pVVar10->nSize) {
      lVar13 = 0;
      do {
        if ((*(uint *)((long)pVVar10->pArray[lVar13] + 0x14) & 0xf) == 8) {
          fputc(*(long *)((long)pVVar10->pArray[lVar13] + 0x38) == 1 ^ 0x31,(FILE *)pFile);
          pVVar10 = pNtk->vBoxes;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < pVVar10->nSize);
    }
    uVar6 = pCex->nRegs;
    if (pCex->nBits <= (int)uVar6) {
      return;
    }
    do {
      if ((fAiger != 0) && ((int)(uVar6 - pCex->nRegs) % pCex->nPis == 0)) {
        fputc(10,(FILE *)pFile);
      }
      fputc((((uint)(&pCex[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0) + 0x30,
            (FILE *)pFile);
      uVar6 = uVar6 + 1;
    } while ((int)uVar6 < pCex->nBits);
    return;
  }
  local_60 = (Abc_Cex_t *)0x0;
  if (fMinimize == 0) {
    fwrite("# FALSIFYING OUTPUTS:",0x15,1,(FILE *)pFile);
    iVar4 = pCex->iPo;
    if (((long)iVar4 < 0) || (pNtk->vCos->nSize <= iVar4)) goto LAB_0032c257;
    pcVar9 = Abc_ObjName((Abc_Obj_t *)pNtk->vCos->pArray[iVar4]);
    pAVar8 = (Abc_Cex_t *)0x0;
    fprintf((FILE *)pFile," %s",pcVar9);
  }
  else {
    pAVar7 = Abc_NtkToDar(pNtk,0,1);
    fwrite("# FALSIFYING OUTPUTS:",0x15,1,(FILE *)pFile);
    iVar4 = pCex->iPo;
    if (((long)iVar4 < 0) || (pNtk->vCos->nSize <= iVar4)) {
LAB_0032c257:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pcVar9 = Abc_ObjName((Abc_Obj_t *)pNtk->vCos->pArray[iVar4]);
    fprintf((FILE *)pFile," %s",pcVar9);
    if (fUseOldMin == 0) {
      if (fUseSatBased == 0) {
        pAVar8 = Bmc_CexCareMinimize(pAVar7,pAVar7->nTruePis,pCex,4,fCheckCex,fVerbose);
        local_60 = pAVar8;
      }
      else {
        pAVar8 = Bmc_CexCareSatBasedMinimize
                           (pAVar7,pAVar7->nTruePis,pCex,fHighEffort,fCheckCex,fVerbose);
        local_60 = pAVar8;
      }
    }
    else {
      pAVar8 = Saig_ManCbaFindCexCareBits(pAVar7,pCex,0,fVerbose);
      local_60 = pAVar8;
      if (fCheckCex != 0) {
        Bmc_CexCareVerify(pAVar7,pCex,pAVar8,fVerbose);
      }
    }
    Aig_ManStop(pAVar7);
    if (pAVar8 == (Abc_Cex_t *)0x0) {
      puts("Counter-example minimization has failed.");
      pAVar8 = (Abc_Cex_t *)0x0;
    }
  }
  fputc(10,(FILE *)pFile);
  fprintf((FILE *)pFile,"# COUNTEREXAMPLE LENGTH: %u\n",(ulong)(pCex->iFrame + 1));
  if ((fUseFfNames == 0) || (iVar4 = Abc_NtkCheckSpecialPi(pNtk), iVar4 == 0)) {
    pVVar10 = pNtk->vBoxes;
    if (0 < pVVar10->nSize) {
      lVar13 = 0;
      do {
        plVar1 = (long *)pVVar10->pArray[lVar13];
        if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
          pcVar9 = Abc_ObjName(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                (long)*(int *)plVar1[6] * 8));
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) != 8) {
            __assert_fail("Abc_ObjIsLatch(pLatch)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                          ,0x1a8,"int Abc_LatchIsInit0(Abc_Obj_t *)");
          }
          fprintf((FILE *)pFile,"%s@0=%c\n",pcVar9,(ulong)(plVar1[7] == 1 ^ 0x31));
          pVVar10 = pNtk->vBoxes;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < pVVar10->nSize);
    }
    iVar4 = pCex->iFrame;
    if (-1 < iVar4) {
      pVVar10 = pNtk->vPis;
      uVar14 = 0;
      do {
        iVar15 = (int)uVar14;
        if (0 < pVVar10->nSize) {
          lVar13 = 0;
          do {
            if ((pAVar8 == (Abc_Cex_t *)0x0) ||
               (uVar6 = pAVar8->nPis * iVar15 + pAVar8->nRegs + (int)lVar13,
               ((uint)(&pAVar8[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0)) {
              pcVar9 = Abc_ObjName((Abc_Obj_t *)pVVar10->pArray[lVar13]);
              uVar6 = (int)lVar13 + pCex->nRegs + pCex->nPis * iVar15;
              fprintf((FILE *)pFile,"%s@%d=%c\n",pcVar9,uVar14,
                      (ulong)((((uint)(&pCex[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0) +
                             0x30));
              pVVar10 = pNtk->vPis;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 < pVVar10->nSize);
          iVar4 = pCex->iFrame;
        }
        uVar14 = (ulong)(iVar15 + 1);
      } while (iVar15 < iVar4);
    }
    goto LAB_0032bae0;
  }
  local_40 = pNtk->vPis;
  iVar4 = local_40->nSize;
  uVar14 = 0;
  if (0 < iVar4) {
    do {
      pcVar9 = Abc_ObjName((Abc_Obj_t *)local_40->pArray[uVar14]);
      iVar4 = strcmp(pcVar9,"_abc_190121_abc_");
      local_40 = pNtk->vPis;
      if (iVar4 == 0) {
        iVar4 = local_40->nSize;
        break;
      }
      uVar14 = uVar14 + 1;
      iVar4 = local_40->nSize;
    } while ((long)uVar14 < (long)iVar4);
  }
  if ((int)uVar14 == iVar4) {
    fwrite("IoCommandWriteCex(): Cannot find special PI required by switch \"-z\".\n",0x45,1,_stdout
          );
    return;
  }
  iVar16 = (int)uVar14 + 1;
  iVar15 = 0;
  local_48 = uVar14;
  if (iVar16 < iVar4) {
    lVar13 = (uVar14 & 0xffffffff) + 1;
    iVar17 = 0;
    do {
      pcVar9 = Abc_ObjName((Abc_Obj_t *)local_40->pArray[lVar13]);
      iVar17 = iVar17 + (uint)(*pcVar9 == 'x');
      lVar13 = lVar13 + 1;
      local_40 = pNtk->vPis;
      iVar4 = local_40->nSize;
    } while ((int)lVar13 < iVar4);
  }
  else {
    iVar17 = 0;
  }
  local_50 = malloc((long)iVar4 << 2);
  memset(local_50,0xff,(long)iVar4 << 2);
  iVar4 = local_40->nSize;
  pVVar10 = local_40;
  local_54 = iVar17;
  if (iVar16 < iVar4) {
    iVar5 = (int)local_48;
    lVar13 = (local_48 & 0xffffffff) + 1;
    iVar15 = 0;
    do {
      pcVar9 = Abc_ObjName((Abc_Obj_t *)pVVar10->pArray[lVar13]);
      if (*pcVar9 == 'x') {
        iVar4 = (iVar5 - iVar17) + iVar15;
        iVar15 = iVar15 + 1;
        *(int *)((long)local_50 + lVar13 * 4) = iVar4;
      }
      lVar13 = lVar13 + 1;
      pVVar10 = pNtk->vPis;
      iVar4 = pVVar10->nSize;
    } while ((int)lVar13 < iVar4);
  }
  if (iVar15 != local_54) {
    __assert_fail("iFlop == nXValues",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/io.c"
                  ,0x9d2,
                  "void Abc_NtkDumpOneCex(FILE *, Abc_Ntk_t *, Abc_Cex_t *, int, int, int, int, int, int, int, int, int, int)"
                 );
  }
  iVar15 = (int)local_48;
  iVar17 = local_54;
  if (iVar16 < iVar4) {
    local_40 = (Vec_Ptr_t *)((long)local_50 + (local_48 & 0xffffffff) * 4 + 4);
    local_38 = (local_48 & 0xffffffff) * 8 + 8;
    lVar13 = 0;
    do {
      lVar3 = local_38;
      iVar4 = (&local_40->nCap)[lVar13];
      if (iVar4 == -1) {
        pcVar9 = Abc_ObjName(*(Abc_Obj_t **)((long)pVVar10->pArray + lVar13 * 8 + local_38));
        if (pNtk->vPis->nSize <= iVar15 + 1 + (int)lVar13) goto LAB_0032c257;
        pcVar11 = Abc_ObjName(*(Abc_Obj_t **)((long)pNtk->vPis->pArray + lVar13 * 8 + lVar3));
        fprintf((FILE *)pFile,"%s@0=%c\n",pcVar9 + 1,(ulong)(uint)(int)*pcVar11);
        iVar17 = local_54;
      }
      else {
        uVar6 = pAVar8->nRegs + iVar4;
        if (((uint)(&pAVar8[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0) {
          pcVar9 = Abc_ObjName(*(Abc_Obj_t **)((long)pVVar10->pArray + lVar13 * 8 + local_38));
          uVar6 = iVar4 + pCex->nRegs;
          fprintf((FILE *)pFile,"%s@0=%c\n",pcVar9 + 1,
                  (ulong)((((uint)(&pCex[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0) +
                         0x30));
        }
      }
      pVVar10 = pNtk->vPis;
      lVar13 = lVar13 + 1;
    } while (iVar15 + 1 + (int)lVar13 < pVVar10->nSize);
LAB_0032c13b:
    free(local_50);
    iVar15 = (int)local_48;
  }
  else if (local_50 != (void *)0x0) goto LAB_0032c13b;
  iVar4 = pCex->iFrame;
  if (-1 < iVar4) {
    local_70 = 0;
    do {
      iVar16 = (int)local_70;
      if (0 < pVVar10->nSize) {
        uVar14 = 0;
        do {
          if ((uint)(iVar15 - iVar17) == uVar14) break;
          if ((pAVar8 == (Abc_Cex_t *)0x0) ||
             (uVar6 = pAVar8->nPis * iVar16 + pAVar8->nRegs + (int)uVar14,
             ((uint)(&pAVar8[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0)) {
            pcVar9 = Abc_ObjName((Abc_Obj_t *)pVVar10->pArray[uVar14]);
            uVar6 = (int)uVar14 + pCex->nRegs + pCex->nPis * iVar16;
            fprintf((FILE *)pFile,"%s@%d=%c\n",pcVar9,local_70,
                    (ulong)((((uint)(&pCex[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0) +
                           0x30));
            pVVar10 = pNtk->vPis;
          }
          uVar14 = uVar14 + 1;
        } while ((long)uVar14 < (long)pVVar10->nSize);
        iVar4 = pCex->iFrame;
      }
      local_70 = (ulong)(iVar16 + 1);
    } while (iVar16 < iVar4);
  }
LAB_0032bae0:
  Abc_CexFreeP(&local_60);
  return;
}

Assistant:

void Abc_NtkDumpOneCex( FILE * pFile, Abc_Ntk_t * pNtk, Abc_Cex_t * pCex, 
    int fPrintFull, int fNames, int fUseFfNames, int fMinimize, int fUseOldMin, 
    int fCheckCex, int fUseSatBased, int fHighEffort, int fAiger, int fVerbose )
{
    Abc_Obj_t * pObj;
    int i, f;
    if ( fPrintFull )
    {
        extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
        Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 1 );
        Abc_Cex_t * pCexFull = Saig_ManExtendCex( pAig, pCex );
        Aig_ManStop( pAig );
        // output PI values (while skipping the minimized ones)
        assert( pCexFull->nBits == Abc_NtkCiNum(pNtk) * (pCex->iFrame + 1) );
        for ( f = 0; f <= pCex->iFrame; f++ )
            Abc_NtkForEachCi( pNtk, pObj, i )
                fprintf( pFile, "%s@%d=%c ", Abc_ObjName(pObj), f, '0'+Abc_InfoHasBit(pCexFull->pData, Abc_NtkCiNum(pNtk)*f + i) );
        Abc_CexFreeP( &pCexFull );
    }
    else if ( fNames )
    {
        Abc_Cex_t * pCare = NULL;
        if ( fMinimize )
        {
            extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
            Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 1 );
            fprintf( pFile, "# FALSIFYING OUTPUTS:");                                       
            fprintf( pFile, " %s", Abc_ObjName(Abc_NtkCo(pNtk, pCex->iPo)) ); 
            if ( fUseOldMin )
            {
                pCare = Saig_ManCbaFindCexCareBits( pAig, pCex, 0, fVerbose );
                if ( fCheckCex )
                    Bmc_CexCareVerify( pAig, pCex, pCare, fVerbose );
            }
            else if ( fUseSatBased )
                pCare = Bmc_CexCareSatBasedMinimize( pAig, Saig_ManPiNum(pAig), pCex, fHighEffort, fCheckCex, fVerbose );
            else
                pCare = Bmc_CexCareMinimize( pAig, Saig_ManPiNum(pAig), pCex, 4, fCheckCex, fVerbose );
            Aig_ManStop( pAig );
            if(pCare == NULL)                                           
                printf( "Counter-example minimization has failed.\n" ); 
        }
        else
        {
            fprintf( pFile, "# FALSIFYING OUTPUTS:");                        
            fprintf( pFile, " %s", Abc_ObjName(Abc_NtkCo(pNtk, pCex->iPo)) );
        }
        fprintf( pFile, "\n");                                           
        fprintf( pFile, "# COUNTEREXAMPLE LENGTH: %u\n", pCex->iFrame+1);
        if ( fUseFfNames && Abc_NtkCheckSpecialPi(pNtk) )
        {
            int * pValues;
            int nXValues = 0, iFlop = 0, iPivotPi = -1;
            Abc_NtkForEachPi( pNtk, pObj, iPivotPi )
                if ( !strcmp(Abc_ObjName(pObj), "_abc_190121_abc_") )
                    break;
            if ( iPivotPi == Abc_NtkPiNum(pNtk) )
            {
                fprintf( stdout, "IoCommandWriteCex(): Cannot find special PI required by switch \"-z\".\n" );
                return;
            }
            // count X-valued flops
            for ( i = iPivotPi+1; i < Abc_NtkPiNum(pNtk); i++ )
                if ( Abc_ObjName(Abc_NtkPi(pNtk, i))[0] == 'x' )
                    nXValues++;
            // map X-valued flops into auxiliary PIs
            pValues = ABC_FALLOC( int, Abc_NtkPiNum(pNtk) );
            for ( i = iPivotPi+1; i < Abc_NtkPiNum(pNtk); i++ )
                if ( Abc_ObjName(Abc_NtkPi(pNtk, i))[0] == 'x' )
                    pValues[i] = iPivotPi - nXValues + iFlop++;
            assert( iFlop == nXValues );
            // write flop values
            for ( i = iPivotPi+1; i < Abc_NtkPiNum(pNtk); i++ )
                if ( pValues[i] == -1 )
                    fprintf( pFile, "%s@0=%c\n", Abc_ObjName(Abc_NtkPi(pNtk, i))+1, Abc_ObjName(Abc_NtkPi(pNtk, i))[0] );
                else if ( Abc_InfoHasBit(pCare->pData, pCare->nRegs + pValues[i]) )
                    fprintf( pFile, "%s@0=%c\n", Abc_ObjName(Abc_NtkPi(pNtk, i))+1, '0'+Abc_InfoHasBit(pCex->pData, pCex->nRegs + pValues[i]) );
            ABC_FREE( pValues );
            // output PI values (while skipping the minimized ones)
            for ( f = 0; f <= pCex->iFrame; f++ )
                Abc_NtkForEachPi( pNtk, pObj, i )
                {
                    if ( i == iPivotPi - nXValues ) break;
                    if ( !pCare || Abc_InfoHasBit(pCare->pData, pCare->nRegs+pCare->nPis*f + i) )
                        fprintf( pFile, "%s@%d=%c\n", Abc_ObjName(pObj), f, '0'+Abc_InfoHasBit(pCex->pData, pCex->nRegs+pCex->nPis*f + i) );
                }
        }
        else
        {
            // output flop values (unaffected by the minimization)
            Abc_NtkForEachLatch( pNtk, pObj, i )
                fprintf( pFile, "%s@0=%c\n", Abc_ObjName(Abc_ObjFanout0(pObj)), '0'+!Abc_LatchIsInit0(pObj) );
            // output PI values (while skipping the minimized ones)
            for ( f = 0; f <= pCex->iFrame; f++ )
                Abc_NtkForEachPi( pNtk, pObj, i )
                    if ( !pCare || Abc_InfoHasBit(pCare->pData, pCare->nRegs+pCare->nPis*f + i) )
                        fprintf( pFile, "%s@%d=%c\n", Abc_ObjName(pObj), f, '0'+Abc_InfoHasBit(pCex->pData, pCex->nRegs+pCex->nPis*f + i) );
        }
        Abc_CexFreeP( &pCare );
    }
    else
    {
        Abc_NtkForEachLatch( pNtk, pObj, i )
            fprintf( pFile, "%c", '0'+!Abc_LatchIsInit0(pObj) );

        for ( i = pCex->nRegs; i < pCex->nBits; i++ )
        {
            if ( fAiger && (i-pCex->nRegs)%pCex->nPis == 0)
                fprintf( pFile, "\n");
            fprintf( pFile, "%c", '0'+Abc_InfoHasBit(pCex->pData, i) );
        }
    }
}